

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O1

NDSTATUS NdParseMemoryOperand3264(INSTRUX *Instrux,ND_OPERAND *Operand,ND_REG_SIZE VsibRegSize)

{
  sbyte sVar1;
  sbyte sVar2;
  uint uVar3;
  ND_UINT8 NVar4;
  byte bVar5;
  ulong uVar6;
  
  NVar4 = (((undefined1  [488])*Instrux & (undefined1  [488])0xc0) != (undefined1  [488])0x40) *
          '\x04' + '\x04';
  *(byte *)((long)&Operand->Info + 10) = *(byte *)((long)&Operand->Info + 10) & 0xf8 | 3;
  if ((Instrux->field_0x6 & 0x10) == 0) {
    if (((Instrux->ModRm).ModRm & 199) == 5) {
      uVar3 = *(uint *)Instrux & 3;
      *(ushort *)&Instrux->field_0x9 =
           *(ushort *)&Instrux->field_0x9 & 0xefff | (ushort)(uVar3 == 2) << 0xc;
      *(ushort *)&Operand->Info =
           (ushort)(Operand->Info).Register.Type & 0xffbf | (ushort)(uVar3 == 2) << 6;
      if ((uVar3 == 2) && ((Instrux->Attributes & 0x2000000) != 0)) {
        return 0x8000000e;
      }
    }
    else {
      (Operand->Info).DefaultFlags =
           (ND_OPDESC_DEFAULT_FLAGS)((byte)(Operand->Info).DefaultFlags | 2);
      (Operand->Info).Memory.BaseSize = NVar4;
      bVar5 = (*(byte *)&Instrux->Exs & 8 | (Instrux->ModRm).ModRm & 7) * '\b';
      *(byte *)((long)&Operand->Info + 10) = bVar5 + 3;
      if (((uint)Instrux->Exs & 0x40) != 0) {
        if ((Instrux->FeatMode & 0x10) == 0) {
          return 0x80000005;
        }
        *(byte *)((long)&Operand->Info + 10) = bVar5 | 0x83;
      }
      bVar5 = *(byte *)((long)&Operand->Info + 10);
      if ((bVar5 & 0xf0) == 0x20) {
        *(byte *)((long)&Operand->Info + 10) = bVar5 & 0x28 | 2;
      }
    }
  }
  else {
    if ((0x3f < (Instrux->ModRm).ModRm) || (((Instrux->Sib).Sib & 7) != 5)) {
      (Operand->Info).DefaultFlags =
           (ND_OPDESC_DEFAULT_FLAGS)((byte)(Operand->Info).DefaultFlags | 2);
      (Operand->Info).Memory.BaseSize = NVar4;
      bVar5 = (*(byte *)&Instrux->Exs & 8 | (Instrux->Sib).Sib & 7) * '\b';
      *(byte *)((long)&Operand->Info + 10) = bVar5 + 3;
      if (((uint)Instrux->Exs & 0x40) != 0) {
        if ((Instrux->FeatMode & 0x10) == 0) {
          return 0x80000005;
        }
        *(byte *)((long)&Operand->Info + 10) = bVar5 | 0x83;
      }
      bVar5 = *(byte *)((long)&Operand->Info + 10);
      if ((bVar5 & 0xf0) == 0x20) {
        *(byte *)((long)&Operand->Info + 10) = bVar5 & 0x28 | 2;
      }
    }
    if ((Instrux->Attributes & 0x80) == 0) {
      bVar5 = *(char *)&Instrux->Exs * '\x02' & 8U | (Instrux->Sib).Sib >> 3 & 7;
      (Operand->Info).Memory.Index = bVar5;
      if (((uint)Instrux->Exs & 0x20) != 0) {
        if ((Instrux->FeatMode & 0x10) == 0) {
          return 0x80000005;
        }
        (Operand->Info).Memory.Index = bVar5 | 0x10;
      }
      if ((Operand->Info).Memory.Index == '\x04') goto LAB_0015eb53;
      (Operand->Info).DefaultFlags =
           (ND_OPDESC_DEFAULT_FLAGS)((byte)(Operand->Info).DefaultFlags | 4);
      (Operand->Info).Memory.IndexSize = NVar4;
    }
    else {
      (Operand->Info).DefaultFlags =
           (ND_OPDESC_DEFAULT_FLAGS)((byte)(Operand->Info).DefaultFlags | 4);
      (Operand->Info).Memory.IndexSize = NVar4;
      (Operand->Info).Memory.Index =
           (SUB41(Instrux->Exs,2) & 0x10) + (SUB41(Instrux->Exs,0) & 4) * '\x02' |
           (Instrux->Sib).Sib >> 3 & 7;
      (Operand->Info).Memory.IndexSize = (ND_UINT8)VsibRegSize;
    }
    (Operand->Info).Register.Count =
         (Operand->Info).Register.Count & 0xf0 | '\x01' << ((Instrux->Sib).Sib >> 6);
  }
LAB_0015eb53:
  *(ushort *)&Operand->Info =
       ((ushort)(Operand->Info).Register.Type & 0xfff7) +
       (*(ushort *)&Instrux->field_0x5 >> 0xd & 1) * 8;
  (Operand->Info).Memory.DispSize = Instrux->field_0xe & 0xf;
  if ((Instrux->field_0x6 & 0x20) == 0) {
    uVar6 = 0;
  }
  else {
    bVar5 = (byte)(*(uint *)&Instrux->field_0xc >> 0xd) & 0x78;
    sVar2 = (bVar5 < 0x41) * ('@' - bVar5);
    sVar1 = (bVar5 < 0x21) * (' ' - bVar5);
    uVar6 = (ulong)((Instrux->field_74).Displacement >> ((byte)(bVar5 - 1) & 0x1f) & 1) *
            ~((ulong)(-1L << sVar2) >> sVar2) |
            (ulong)(((Instrux->field_74).Displacement << sVar1) >> sVar1);
  }
  (Operand->Info).Memory.Disp = uVar6;
  return 0;
}

Assistant:

static NDSTATUS
NdParseMemoryOperand3264(
    INSTRUX *Instrux,
    ND_OPERAND *Operand,
    ND_REG_SIZE VsibRegSize
    )
{
    ND_UINT8 defsize = (Instrux->AddrMode == ND_ADDR_32 ? ND_SIZE_32BIT : ND_SIZE_64BIT);

    // Implicit segment is DS.
    Operand->Info.Memory.Seg = NDR_DS;

    if (Instrux->HasSib)
    {
        // Check for base.
        if ((Instrux->ModRm.mod == 0) && (Instrux->Sib.base == NDR_RBP))
        {
            // Mod is mem without displacement and base reg is RBP -> no base reg used.
            // Note that this addressing mode is not RIP relative.
        }
        else
        {
            Operand->Info.Memory.HasBase = ND_TRUE;
            Operand->Info.Memory.BaseSize = defsize;
            Operand->Info.Memory.Base = (ND_UINT8)(Instrux->Exs.b << 3) | Instrux->Sib.base;

            if (Instrux->Exs.b4 != 0)
            {
                // If APX is present, extend the base.
                if (Instrux->FeatMode & ND_FEAT_APX)
                {
                    Operand->Info.Memory.Base |= Instrux->Exs.b4 << 4;
                }
                else
                {
                    return ND_STATUS_INVALID_REGISTER_IN_INSTRUCTION;
                }
            }

            if ((Operand->Info.Memory.Base == NDR_RSP) || (Operand->Info.Memory.Base == NDR_RBP))
            {
                Operand->Info.Memory.Seg = NDR_SS;
            }
        }

        // Check for index.
        if (ND_HAS_VSIB(Instrux))
        {
            // With VSIB, the index reg can be 4 (RSP equivalent). Bit 4 of the 32-bit index register is given by the
            // EVEX.V' field.
            Operand->Info.Memory.HasIndex = ND_TRUE;
            Operand->Info.Memory.IndexSize = defsize;
            Operand->Info.Memory.Index = (ND_UINT8)((Instrux->Exs.vp << 4) | (Instrux->Exs.x << 3) | Instrux->Sib.index);
            Operand->Info.Memory.IndexSize = (ND_UINT8)VsibRegSize;
            Operand->Info.Memory.Scale = 1 << Instrux->Sib.scale;
        }
        else
        {
            // Regular SIB, index RSP is ignored. Bit 4 of the 32-bit index register is given by the X4 field.
            Operand->Info.Memory.Index = (ND_UINT8)(Instrux->Exs.x << 3) | Instrux->Sib.index;

            if (Instrux->Exs.x4 != 0)
            {
                // If APX is present, extend the index.
                if (Instrux->FeatMode & ND_FEAT_APX)
                {
                    Operand->Info.Memory.Index |= Instrux->Exs.x4 << 4;
                }
                else
                {
                    return ND_STATUS_INVALID_REGISTER_IN_INSTRUCTION;
                }
            }

            if (Operand->Info.Memory.Index != NDR_RSP)
            {
                // Index * Scale is present.
                Operand->Info.Memory.HasIndex = ND_TRUE;
                Operand->Info.Memory.IndexSize = defsize;
                Operand->Info.Memory.Scale = 1 << Instrux->Sib.scale;
            }
        }
    }
    else
    {
        if ((Instrux->ModRm.mod == 0) && (Instrux->ModRm.rm == NDR_RBP))
        {
            //
            // RIP relative addressing addresses a memory region relative to the current RIP; However,
            // the current RIP, when executing the current instruction, is already updated and points
            // to the next instruction, therefore, we must add the instruction length also to the final
            // address. Note that RIP relative addressing is used even if the instruction uses 32 bit
            // addressing, as long as we're in long mode.
            //
            Operand->Info.Memory.IsRipRel = Instrux->IsRipRelative = (Instrux->DefCode == ND_CODE_64);

            // Some instructions (example: MPX) don't support RIP relative addressing.
            if (Operand->Info.Memory.IsRipRel && !!(Instrux->Attributes & ND_FLAG_NO_RIP_REL))
            {
                return ND_STATUS_RIP_REL_ADDRESSING_NOT_SUPPORTED;
            }
        }
        else
        {
            Operand->Info.Memory.HasBase = ND_TRUE;
            Operand->Info.Memory.BaseSize = defsize;
            Operand->Info.Memory.Base = (ND_UINT8)(Instrux->Exs.b << 3) | Instrux->ModRm.rm;

            if (Instrux->Exs.b4 != 0)
            {
                // If APX is present, extend the base register.
                if (Instrux->FeatMode & ND_FEAT_APX)
                {
                    Operand->Info.Memory.Base |= Instrux->Exs.b4 << 4;
                }
                else
                {
                    return ND_STATUS_INVALID_REGISTER_IN_INSTRUCTION;
                }
            }

            if ((Operand->Info.Memory.Base == NDR_RSP) || (Operand->Info.Memory.Base == NDR_RBP))
            {
                Operand->Info.Memory.Seg = NDR_SS;
            }
        }
    }

    Operand->Info.Memory.HasDisp = Instrux->HasDisp;
    Operand->Info.Memory.DispSize = Instrux->DispLength;
    Operand->Info.Memory.Disp = Instrux->HasDisp ? ND_SIGN_EX(Instrux->DispLength, Instrux->Displacement) : 0;

    return ND_STATUS_SUCCESS;
}